

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

void __thiscall
pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>::GeneralMedium
          (GeneralMedium<pbrt::NanoVDBMediumProvider> *this,NanoVDBMediumProvider *provider,
          SpectrumHandle *sigma_a,SpectrumHandle *sigma_s,Float sigScale,Float g,
          Transform *renderFromMedium,Allocator alloc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  float fVar16;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_50;
  
  this->provider = provider;
  fVar16 = (provider->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(provider->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
  (this->mediumBounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (provider->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (this->mediumBounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar16;
  *(undefined8 *)&(this->mediumBounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar1;
  fVar16 = (provider->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
  (this->mediumBounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (provider->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
  (this->mediumBounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar16;
  local_50.alloc.memoryResource =
       (memory_resource *)
       (sigma_a->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->sigma_a_spec,(SpectrumHandle *)&local_50,0x168,0x33e,alloc);
  local_50.alloc.memoryResource =
       (memory_resource *)
       (sigma_s->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->sigma_s_spec,(SpectrumHandle *)&local_50,0x168,0x33e,alloc);
  this->sigScale = sigScale;
  (this->phase).g = g;
  uVar1 = *(undefined8 *)((renderFromMedium->mInv).m[0] + 2);
  uVar2 = *(undefined8 *)(renderFromMedium->mInv).m[1];
  uVar3 = *(undefined8 *)((renderFromMedium->mInv).m[1] + 2);
  uVar4 = *(undefined8 *)(renderFromMedium->mInv).m[2];
  uVar5 = *(undefined8 *)((renderFromMedium->mInv).m[2] + 2);
  uVar6 = *(undefined8 *)(renderFromMedium->mInv).m[3];
  uVar7 = *(undefined8 *)((renderFromMedium->mInv).m[3] + 2);
  *(undefined8 *)(this->mediumFromRender).m.m[0] = *(undefined8 *)(renderFromMedium->mInv).m[0];
  *(undefined8 *)((this->mediumFromRender).m.m[0] + 2) = uVar1;
  *(undefined8 *)(this->mediumFromRender).m.m[1] = uVar2;
  *(undefined8 *)((this->mediumFromRender).m.m[1] + 2) = uVar3;
  *(undefined8 *)(this->mediumFromRender).m.m[2] = uVar4;
  *(undefined8 *)((this->mediumFromRender).m.m[2] + 2) = uVar5;
  *(undefined8 *)(this->mediumFromRender).m.m[3] = uVar6;
  *(undefined8 *)((this->mediumFromRender).m.m[3] + 2) = uVar7;
  uVar1 = *(undefined8 *)((renderFromMedium->m).m[0] + 2);
  uVar2 = *(undefined8 *)(renderFromMedium->m).m[1];
  uVar3 = *(undefined8 *)((renderFromMedium->m).m[1] + 2);
  uVar4 = *(undefined8 *)(renderFromMedium->m).m[2];
  uVar5 = *(undefined8 *)((renderFromMedium->m).m[2] + 2);
  uVar6 = *(undefined8 *)(renderFromMedium->m).m[3];
  uVar7 = *(undefined8 *)((renderFromMedium->m).m[3] + 2);
  *(undefined8 *)(this->mediumFromRender).mInv.m[0] = *(undefined8 *)(renderFromMedium->m).m[0];
  *(undefined8 *)((this->mediumFromRender).mInv.m[0] + 2) = uVar1;
  *(undefined8 *)(this->mediumFromRender).mInv.m[1] = uVar2;
  *(undefined8 *)((this->mediumFromRender).mInv.m[1] + 2) = uVar3;
  *(undefined8 *)(this->mediumFromRender).mInv.m[2] = uVar4;
  *(undefined8 *)((this->mediumFromRender).mInv.m[2] + 2) = uVar5;
  *(undefined8 *)(this->mediumFromRender).mInv.m[3] = uVar6;
  *(undefined8 *)((this->mediumFromRender).mInv.m[3] + 2) = uVar7;
  uVar1 = *(undefined8 *)(renderFromMedium->m).m[0];
  uVar2 = *(undefined8 *)((renderFromMedium->m).m[0] + 2);
  uVar3 = *(undefined8 *)(renderFromMedium->m).m[1];
  uVar4 = *(undefined8 *)((renderFromMedium->m).m[1] + 2);
  uVar5 = *(undefined8 *)(renderFromMedium->m).m[2];
  uVar6 = *(undefined8 *)((renderFromMedium->m).m[2] + 2);
  uVar7 = *(undefined8 *)(renderFromMedium->m).m[3];
  uVar8 = *(undefined8 *)((renderFromMedium->m).m[3] + 2);
  uVar9 = *(undefined8 *)((renderFromMedium->mInv).m[0] + 2);
  uVar10 = *(undefined8 *)(renderFromMedium->mInv).m[1];
  uVar11 = *(undefined8 *)((renderFromMedium->mInv).m[1] + 2);
  uVar12 = *(undefined8 *)(renderFromMedium->mInv).m[2];
  uVar13 = *(undefined8 *)((renderFromMedium->mInv).m[2] + 2);
  uVar14 = *(undefined8 *)(renderFromMedium->mInv).m[3];
  uVar15 = *(undefined8 *)((renderFromMedium->mInv).m[3] + 2);
  *(undefined8 *)(this->renderFromMedium).mInv.m[0] = *(undefined8 *)(renderFromMedium->mInv).m[0];
  *(undefined8 *)((this->renderFromMedium).mInv.m[0] + 2) = uVar9;
  *(undefined8 *)(this->renderFromMedium).mInv.m[1] = uVar10;
  *(undefined8 *)((this->renderFromMedium).mInv.m[1] + 2) = uVar11;
  *(undefined8 *)(this->renderFromMedium).mInv.m[2] = uVar12;
  *(undefined8 *)((this->renderFromMedium).mInv.m[2] + 2) = uVar13;
  *(undefined8 *)(this->renderFromMedium).mInv.m[3] = uVar14;
  *(undefined8 *)((this->renderFromMedium).mInv.m[3] + 2) = uVar15;
  *(undefined8 *)(this->renderFromMedium).m.m[0] = uVar1;
  *(undefined8 *)((this->renderFromMedium).m.m[0] + 2) = uVar2;
  *(undefined8 *)(this->renderFromMedium).m.m[1] = uVar3;
  *(undefined8 *)((this->renderFromMedium).m.m[1] + 2) = uVar4;
  *(undefined8 *)(this->renderFromMedium).m.m[2] = uVar5;
  *(undefined8 *)((this->renderFromMedium).m.m[2] + 2) = uVar6;
  *(undefined8 *)(this->renderFromMedium).m.m[3] = uVar7;
  *(undefined8 *)((this->renderFromMedium).m.m[3] + 2) = uVar8;
  (this->maxDensityGrid).alloc.memoryResource = alloc.memoryResource;
  (this->maxDensityGrid).ptr = (float *)0x0;
  (this->maxDensityGrid).nAlloc = 0;
  (this->maxDensityGrid).nStored = 0;
  (this->gridResolution).super_Tuple3<pbrt::Point3,_int>.x = 0;
  (this->gridResolution).super_Tuple3<pbrt::Point3,_int>.y = 0;
  (this->gridResolution).super_Tuple3<pbrt::Point3,_int>.z = 0;
  NanoVDBMediumProvider::GetMaxDensityGrid(&local_50,provider,alloc,&this->gridResolution);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&this->maxDensityGrid,&local_50);
  local_50.nStored = 0;
  (*(local_50.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_50.alloc.memoryResource,local_50.ptr,local_50.nAlloc << 2,4);
  return;
}

Assistant:

GeneralMedium(const DensityProvider *provider, SpectrumHandle sigma_a,
                  SpectrumHandle sigma_s, Float sigScale, Float g,
                  const Transform &renderFromMedium, Allocator alloc)
        : provider(provider),
          mediumBounds(provider->Bounds()),
          sigma_a_spec(sigma_a, alloc),
          sigma_s_spec(sigma_s, alloc),
          sigScale(sigScale),
          phase(g),
          mediumFromRender(Inverse(renderFromMedium)),
          renderFromMedium(renderFromMedium),
          maxDensityGrid(alloc) {
        maxDensityGrid = provider->GetMaxDensityGrid(alloc, &gridResolution);
    }